

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

Parser * __thiscall
Catch::Clara::Detail::ComposableParserImpl<Catch::Clara::ExeName>::operator|
          (Parser *__return_storage_ptr__,ComposableParserImpl<Catch::Clara::ExeName> *this,
          Help *other)

{
  Parser PStack_e8;
  Parser local_88;
  
  local_88.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.m_exeName.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_88.m_exeName.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88.m_exeName.m_name.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_88.m_exeName.m_name.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88.super_ParserBase._vptr_ParserBase = (_func_int **)0x0;
  local_88.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)(_func_int **)0x0;
  Parser::Parser(&local_88);
  Parser::operator|(&PStack_e8,&local_88,(ExeName *)this);
  Parser::operator|(__return_storage_ptr__,&PStack_e8,other);
  Parser::~Parser(&PStack_e8);
  Parser::~Parser(&local_88);
  return __return_storage_ptr__;
}

Assistant:

Parser
                ComposableParserImpl<DerivedT>::operator|(T const& other) const {
                return Parser() | static_cast<DerivedT const&>(*this) | other;
            }